

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

bool __thiscall
ctemplate::SectionTemplateNode::AddVariableNode
          (SectionTemplateNode *this,TemplateToken *token,Template *my_template)

{
  TemplateContext my_context;
  HtmlParser *this_00;
  char *pcVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  VariableTemplateNode *this_01;
  char *local_108;
  VariableTemplateNode *local_c8;
  undefined1 local_c0 [8];
  vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
  modvals;
  undefined8 local_a0;
  byte local_93;
  byte local_92;
  allocator local_91;
  string local_90 [55];
  allocator local_59;
  string local_58 [8];
  string variable_name;
  TemplateContext initial_context;
  HtmlParser *htmlparser;
  bool success;
  Template *my_template_local;
  TemplateToken *token_local;
  SectionTemplateNode *this_local;
  
  if (token == (TemplateToken *)0x0) {
    __assert_fail("token",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                  ,0x62e,
                  "bool ctemplate::SectionTemplateNode::AddVariableNode(TemplateToken *, Template *)"
                 );
  }
  htmlparser._7_1_ = true;
  this_00 = my_template->htmlparser_;
  my_context = my_template->initial_context_;
  if (my_context != TC_MANUAL) {
    pcVar1 = token->text;
    uVar2 = token->textlen;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,pcVar1,uVar2,&local_59);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_58,"BI_SPACE");
    if ((bVar3) ||
       (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_58,"BI_NEWLINE"), bVar3)) {
      if ((my_context == TC_HTML) || ((my_context == TC_JS || (my_context == TC_CSS)))) {
        if (this_00 == (HtmlParser *)0x0) {
          __assert_fail("htmlparser",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                        ,0x63e,
                        "bool ctemplate::SectionTemplateNode::AddVariableNode(TemplateToken *, Template *)"
                       );
        }
        local_92 = 0;
        local_93 = 0;
        iVar4 = ctemplate_htmlparser::HtmlParser::state(this_00);
        bVar3 = true;
        if (iVar4 != 7) {
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_58,"BI_SPACE");
          if (bVar3) {
            local_108 = " ";
          }
          else {
            local_108 = "\n";
          }
          std::allocator<char>::allocator();
          local_92 = 1;
          std::__cxx11::string::string(local_90,local_108,&local_91);
          local_93 = 1;
          iVar4 = ctemplate_htmlparser::HtmlParser::Parse(this_00,(string *)local_90);
          bVar3 = iVar4 == 7;
        }
        if ((local_93 & 1) != 0) {
          std::__cxx11::string::~string(local_90);
        }
        if ((local_92 & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_91);
        }
        htmlparser._7_1_ = !bVar3;
      }
    }
    else {
      local_a0 = std::__cxx11::string::c_str();
      bVar3 = std::binary_search<char_const*const*,char_const*,ctemplate::StringHash>
                        (&Template::kSafeWhitelistedVariables,&vtable,&local_a0);
      if (!bVar3) {
        anon_unknown_14::GetModifierForContext
                  ((vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                    *)local_c0,my_context,this_00,my_template);
        bVar3 = std::
                vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                ::empty((vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                         *)local_c0);
        if (!bVar3) {
          TemplateToken::UpdateModifier
                    (token,(vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                            *)local_c0);
        }
        htmlparser._7_1_ = !bVar3;
        std::
        vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
        ::~vector((vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                   *)local_c0);
      }
    }
    std::__cxx11::string::~string(local_58);
  }
  this_01 = (VariableTemplateNode *)operator_new(0x58);
  VariableTemplateNode::VariableTemplateNode(this_01,token);
  local_c8 = this_01;
  std::__cxx11::list<ctemplate::TemplateNode_*,_std::allocator<ctemplate::TemplateNode_*>_>::
  push_back(&this->node_list_,(value_type *)&local_c8);
  return htmlparser._7_1_;
}

Assistant:

bool SectionTemplateNode::AddVariableNode(TemplateToken* token,
                                          Template* my_template) {
  assert(token);
  bool success = true;
  HtmlParser *htmlparser = my_template->htmlparser_;
  TemplateContext initial_context = my_template->initial_context_;

  if (AUTO_ESCAPE_MODE(initial_context)) {
    // Determines modifiers for the variable in auto escape mode.
    string variable_name(token->text, token->textlen);
    // We declare in the documentation that if the user changes the
    // value of these variables, they must only change it to a value
    // that's "equivalent" from the point of view of an html parser.
    // So it's ok to hard-code in that these are " " and "\n",
    // respectively, even though in theory the user could change them
    // (to say, BI_NEWLINE == "\r\n").
    if (variable_name == "BI_SPACE" || variable_name == "BI_NEWLINE") {
      if (AUTO_ESCAPE_PARSING_CONTEXT(initial_context)) {
        assert(htmlparser);
        if (htmlparser->state() == HtmlParser::STATE_ERROR ||
            htmlparser->Parse(variable_name == "BI_SPACE" ? " " : "\n") ==
            HtmlParser::STATE_ERROR)
          success = false;
      }
    } else if (binary_search(Template::kSafeWhitelistedVariables,
                             Template::kSafeWhitelistedVariables +
                             arraysize(Template::kSafeWhitelistedVariables),
                             variable_name.c_str(),
                             // Luckily, StringHash(a, b) is defined as "a < b"
                             StringHash())) {
      // Do not escape the variable, it is whitelisted.
    } else {
      vector<const ModifierAndValue*> modvals =
          GetModifierForContext(initial_context, htmlparser, my_template);
      // There should always be at least one modifier in any Auto-Escape mode.
      if (modvals.empty())
        success = false;
      else
        token->UpdateModifier(modvals);
    }
  }
  node_list_.push_back(new VariableTemplateNode(*token));
  return success;
}